

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O0

Up __thiscall yactfr::internal::TsdlParser::_tryParseNtStrType(TsdlParser *this)

{
  bool bVar1;
  TsdlParser *in_RSI;
  TextLocation local_140;
  TsdlAttr *attr;
  iterator __end2;
  iterator __begin2;
  _tAttrs *__range2;
  undefined1 local_70 [8];
  _tAttrs attrs;
  undefined1 local_40 [24];
  TextLocation beginLoc;
  TsdlParser *this_local;
  
  StrScanner::skipCommentsAndWhitespaces<true,true>(&in_RSI->_ss);
  StrScanner::loc((TextLocation *)(local_40 + 0x10),&in_RSI->_ss);
  bVar1 = StrScanner::tryScanToken(&in_RSI->_ss,"string");
  if (bVar1) {
    bVar1 = StrScanner::tryScanToken(&in_RSI->_ss,"{");
    if (bVar1) {
      std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::vector
                ((vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_> *)
                 local_70);
      while( true ) {
        _skipCommentsAndWhitespacesAndSemicolons(in_RSI);
        bVar1 = StrScanner::tryScanToken(&in_RSI->_ss,"}");
        if (bVar1) break;
        _expectAttr((TsdlAttr *)&__range2,in_RSI);
        std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::
        push_back((vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_> *
                  )local_70,(value_type *)&__range2);
        TsdlAttr::~TsdlAttr((TsdlAttr *)&__range2);
      }
      _checkDupAttr((_tAttrs *)local_70);
      __end2 = std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>
               ::begin((vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>
                        *)local_70);
      attr = (TsdlAttr *)
             std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::
             end((vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_> *)
                 local_70);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<yactfr::internal::TsdlAttr_*,_std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>_>
                                    *)&attr);
        if (!bVar1) break;
        local_140._colNumber =
             (Index)__gnu_cxx::
                    __normal_iterator<yactfr::internal::TsdlAttr_*,_std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>_>
                    ::operator*(&__end2);
        bVar1 = std::operator==(&((reference)local_140._colNumber)->name,"encoding");
        if (bVar1) {
          TsdlAttr::hasEncoding((TsdlAttr *)local_140._colNumber);
        }
        else {
          TsdlAttr::throwUnknown((TsdlAttr *)local_140._colNumber);
        }
        __gnu_cxx::
        __normal_iterator<yactfr::internal::TsdlAttr_*,_std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>_>
        ::operator++(&__end2);
      }
      std::make_unique<yactfr::NullTerminatedStringType_const,int>((int *)&local_140);
      std::
      make_unique<yactfr::internal::PseudoScalarDtWrapper,std::unique_ptr<yactfr::NullTerminatedStringType_const,std::default_delete<yactfr::NullTerminatedStringType_const>>,yactfr::TextLocation_const&>
                ((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                  *)&local_140._lineNumber,&local_140);
      std::unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>::
      unique_ptr<yactfr::internal::PseudoScalarDtWrapper,std::default_delete<yactfr::internal::PseudoScalarDtWrapper>,void>
                ((unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>
                  *)this,(unique_ptr<yactfr::internal::PseudoScalarDtWrapper,_std::default_delete<yactfr::internal::PseudoScalarDtWrapper>_>
                          *)&local_140._lineNumber);
      std::
      unique_ptr<yactfr::internal::PseudoScalarDtWrapper,_std::default_delete<yactfr::internal::PseudoScalarDtWrapper>_>
      ::~unique_ptr((unique_ptr<yactfr::internal::PseudoScalarDtWrapper,_std::default_delete<yactfr::internal::PseudoScalarDtWrapper>_>
                     *)&local_140._lineNumber);
      std::
      unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
      ::~unique_ptr((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                     *)&local_140);
      std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::~vector
                ((vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_> *)
                 local_70);
    }
    else {
      std::make_unique<yactfr::NullTerminatedStringType_const,int>((int *)local_40);
      std::
      make_unique<yactfr::internal::PseudoScalarDtWrapper,std::unique_ptr<yactfr::NullTerminatedStringType_const,std::default_delete<yactfr::NullTerminatedStringType_const>>,yactfr::TextLocation_const&>
                ((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                  *)(local_40 + 8),(TextLocation *)local_40);
      std::unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>::
      unique_ptr<yactfr::internal::PseudoScalarDtWrapper,std::default_delete<yactfr::internal::PseudoScalarDtWrapper>,void>
                ((unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>
                  *)this,(unique_ptr<yactfr::internal::PseudoScalarDtWrapper,_std::default_delete<yactfr::internal::PseudoScalarDtWrapper>_>
                          *)(local_40 + 8));
      std::
      unique_ptr<yactfr::internal::PseudoScalarDtWrapper,_std::default_delete<yactfr::internal::PseudoScalarDtWrapper>_>
      ::~unique_ptr((unique_ptr<yactfr::internal::PseudoScalarDtWrapper,_std::default_delete<yactfr::internal::PseudoScalarDtWrapper>_>
                     *)(local_40 + 8));
      std::
      unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
      ::~unique_ptr((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                     *)local_40);
    }
  }
  else {
    std::unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>::
    unique_ptr<std::default_delete<yactfr::internal::PseudoDt>,void>
              ((unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>
                *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )this;
}

Assistant:

PseudoDt::Up TsdlParser::_tryParseNtStrType()
{
    _ss.skipCommentsAndWhitespaces();

    const auto beginLoc = _ss.loc();

    // parse `string`
    if (!_ss.tryScanToken("string")) {
        return nullptr;
    }

    // try to parse `{`
    if (!_ss.tryScanToken("{")) {
        return std::make_unique<PseudoScalarDtWrapper>(std::make_unique<const NullTerminatedStringType>(8),
                                                       beginLoc);
    }

    // parse attributes
    _tAttrs attrs;

    while (true) {
        this->_skipCommentsAndWhitespacesAndSemicolons();

        // end of block?
        if (_ss.tryScanToken("}")) {
            break;
        }

        // parse attribute
        attrs.push_back(this->_expectAttr());
    }

    // check for duplicate attributes
    TsdlParser::_checkDupAttr(attrs);

    // check attributes
    for (const auto& attr : attrs) {
        if (attr.name == "encoding") {
            // only used to validate
            attr.hasEncoding();
        } else {
            attr.throwUnknown();
        }
    }

    return std::make_unique<PseudoScalarDtWrapper>(std::make_unique<const NullTerminatedStringType>(8),
                                                   beginLoc);
}